

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

void __thiscall
cfd::core::
JsonObjectVector<cfd::api::json::DecodeRawTransactionTxIn,_DecodeRawTransactionTxInStruct>::
ConvertFromStruct(JsonObjectVector<cfd::api::json::DecodeRawTransactionTxIn,_DecodeRawTransactionTxInStruct>
                  *this,vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
                        *list)

{
  pointer pDVar1;
  pointer data;
  DecodeRawTransactionTxIn object;
  DecodeRawTransactionTxIn local_140;
  
  pDVar1 = (list->
           super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (data = (list->
              super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
              )._M_impl.super__Vector_impl_data._M_start; data != pDVar1; data = data + 1) {
    cfd::api::json::DecodeRawTransactionTxIn::DecodeRawTransactionTxIn(&local_140);
    cfd::api::json::DecodeRawTransactionTxIn::ConvertFromStruct(&local_140,data);
    ::std::
    vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
    ::push_back(&(this->super_JsonVector<cfd::api::json::DecodeRawTransactionTxIn>).
                 super_vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
                ,&local_140);
    cfd::api::json::DecodeRawTransactionTxIn::~DecodeRawTransactionTxIn(&local_140);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }